

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O1

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 uVar2;
  void *pvVar3;
  bool bVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv__queue *puVar6;
  uv_udp_t *puVar7;
  uv_loop_t *puVar8;
  uv__queue **__ptr;
  undefined1 *in_R8;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b;
  sockaddr_in addr;
  uv_udp_send_t req;
  void *pvStack_200;
  uv_loop_t *puStack_1f8;
  uv_close_cb p_Stack_1e8;
  uv__queue *puStack_1e0;
  uv__queue *puStack_1d8;
  undefined1 auStack_1d0 [16];
  size_t sStack_1c0;
  uv_loop_t *puStack_1b8;
  undefined1 auStack_198 [24];
  uv__queue *local_180;
  undefined1 local_178 [16];
  uv__queue *local_168;
  undefined1 local_160 [16];
  uv__queue *local_150 [41];
  uv_loop_t *puVar5;
  
  auStack_198._8_8_ = (uv__queue *)0x1d8e82;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_160);
  local_150[0] = (uv__queue *)(long)iVar1;
  local_178._8_8_ = (uv_loop_t *)0x0;
  if (local_150[0] == (uv__queue *)0x0) {
    auStack_198._8_8_ = (uv__queue *)0x1d8ea7;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1d8eb6;
    iVar1 = uv_udp_init(uVar2,&server);
    local_150[0] = (uv__queue *)(long)iVar1;
    local_178._8_8_ = (uv_loop_t *)0x0;
    if (local_150[0] != (uv__queue *)0x0) goto LAB_001d91ff;
    auStack_198._8_8_ = (uv__queue *)0x1d8ee9;
    iVar1 = uv_udp_bind(&server,local_160,0);
    local_150[0] = (uv__queue *)(long)iVar1;
    local_178._8_8_ = (uv_loop_t *)0x0;
    if (local_150[0] != (uv__queue *)0x0) goto LAB_001d920e;
    auStack_198._8_8_ = (uv__queue *)0x1d8f23;
    iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
    local_150[0] = (uv__queue *)(long)iVar1;
    local_178._8_8_ = (uv_loop_t *)0x0;
    if (local_150[0] != (uv__queue *)0x0) goto LAB_001d921d;
    auStack_198._8_8_ = (uv__queue *)0x1d8f59;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_160);
    local_150[0] = (uv__queue *)(long)iVar1;
    local_178._8_8_ = (uv_loop_t *)0x0;
    if (local_150[0] != (uv__queue *)0x0) goto LAB_001d922c;
    auStack_198._8_8_ = (uv__queue *)0x1d8f7e;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1d8f8d;
    iVar1 = uv_udp_init(uVar2,&client);
    local_150[0] = (uv__queue *)(long)iVar1;
    local_178._8_8_ = (uv_loop_t *)0x0;
    if (local_150[0] != (uv__queue *)0x0) goto LAB_001d923b;
    auStack_198._8_8_ = (uv__queue *)0x1d8fbe;
    join_0x00000010_0x00000000_ = uv_buf_init("PING",4);
    in_R8 = local_160;
    auStack_198._8_8_ = (uv__queue *)0x1d8fef;
    iVar1 = uv_udp_send(local_150,&client,local_178 + 8,1,in_R8,cl_send_cb);
    local_178._0_8_ = SEXT48(iVar1);
    local_180 = (uv__queue *)0x0;
    if ((uv__queue *)local_178._0_8_ != (uv__queue *)0x0) goto LAB_001d924a;
    local_178._0_8_ = SEXT48(close_cb_called);
    local_180 = (uv__queue *)0x0;
    if ((uv__queue *)local_178._0_8_ != (uv__queue *)0x0) goto LAB_001d9259;
    local_178._0_8_ = SEXT48(cl_send_cb_called);
    local_180 = (uv__queue *)0x0;
    if ((uv__queue *)local_178._0_8_ != (uv__queue *)0x0) goto LAB_001d9268;
    local_178._0_8_ = SEXT48(cl_recv_cb_called);
    local_180 = (uv__queue *)0x0;
    if ((uv__queue *)local_178._0_8_ != (uv__queue *)0x0) goto LAB_001d9277;
    local_178._0_8_ = SEXT48(sv_send_cb_called);
    local_180 = (uv__queue *)0x0;
    if ((uv__queue *)local_178._0_8_ != (uv__queue *)0x0) goto LAB_001d9286;
    local_178._0_8_ = SEXT48(sv_recv_cb_called);
    local_180 = (uv__queue *)0x0;
    if ((uv__queue *)local_178._0_8_ != (uv__queue *)0x0) goto LAB_001d9295;
    auStack_198._8_8_ = (uv__queue *)0x1d90cd;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1d90d7;
    uv_run(uVar2,0);
    local_178._0_8_ = (uv__queue *)0x1;
    local_180 = (uv__queue *)(long)cl_send_cb_called;
    if (local_180 != (uv__queue *)0x1) goto LAB_001d92a4;
    local_178._0_8_ = (uv__queue *)0x1;
    local_180 = (uv__queue *)(long)cl_recv_cb_called;
    if (local_180 != (uv__queue *)0x1) goto LAB_001d92b3;
    local_178._0_8_ = (uv__queue *)0x1;
    local_180 = (uv__queue *)(long)sv_send_cb_called;
    if (local_180 != (uv__queue *)0x1) goto LAB_001d92c2;
    local_178._0_8_ = (uv__queue *)0x1;
    local_180 = (uv__queue *)(long)sv_recv_cb_called;
    if (local_180 != (uv__queue *)0x1) goto LAB_001d92d1;
    local_178._0_8_ = (uv__queue *)0x2;
    local_180 = (uv__queue *)(long)close_cb_called;
    if (local_180 != (uv__queue *)0x2) goto LAB_001d92e0;
    auStack_198._8_8_ = (uv__queue *)0x1d9195;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1d91a9;
    uv_walk(unaff_RBX,close_walk_cb,0);
    auStack_198._8_8_ = (uv__queue *)0x1d91b3;
    uv_run(unaff_RBX,0);
    local_178._0_8_ = (uv__queue *)0x0;
    auStack_198._8_8_ = (uv__queue *)0x1d91c1;
    uVar2 = uv_default_loop();
    auStack_198._8_8_ = (uv__queue *)0x1d91c9;
    iVar1 = uv_loop_close(uVar2);
    local_180 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)local_178._0_8_ == local_180) {
      auStack_198._8_8_ = (uv__queue *)0x1d91e5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_198._8_8_ = (uv__queue *)0x1d91ff;
    run_test_udp_alloc_cb_fail_cold_1();
LAB_001d91ff:
    auStack_198._8_8_ = (uv__queue *)0x1d920e;
    run_test_udp_alloc_cb_fail_cold_2();
LAB_001d920e:
    auStack_198._8_8_ = (uv__queue *)0x1d921d;
    run_test_udp_alloc_cb_fail_cold_3();
LAB_001d921d:
    auStack_198._8_8_ = (uv__queue *)0x1d922c;
    run_test_udp_alloc_cb_fail_cold_4();
LAB_001d922c:
    auStack_198._8_8_ = (uv__queue *)0x1d923b;
    run_test_udp_alloc_cb_fail_cold_5();
LAB_001d923b:
    auStack_198._8_8_ = (uv__queue *)0x1d924a;
    run_test_udp_alloc_cb_fail_cold_6();
LAB_001d924a:
    auStack_198._8_8_ = (uv__queue *)0x1d9259;
    run_test_udp_alloc_cb_fail_cold_7();
LAB_001d9259:
    auStack_198._8_8_ = (uv__queue *)0x1d9268;
    run_test_udp_alloc_cb_fail_cold_8();
LAB_001d9268:
    auStack_198._8_8_ = (uv__queue *)0x1d9277;
    run_test_udp_alloc_cb_fail_cold_9();
LAB_001d9277:
    auStack_198._8_8_ = (uv__queue *)0x1d9286;
    run_test_udp_alloc_cb_fail_cold_10();
LAB_001d9286:
    auStack_198._8_8_ = (uv__queue *)0x1d9295;
    run_test_udp_alloc_cb_fail_cold_11();
LAB_001d9295:
    auStack_198._8_8_ = (uv__queue *)0x1d92a4;
    run_test_udp_alloc_cb_fail_cold_12();
LAB_001d92a4:
    auStack_198._8_8_ = (uv__queue *)0x1d92b3;
    run_test_udp_alloc_cb_fail_cold_13();
LAB_001d92b3:
    auStack_198._8_8_ = (uv__queue *)0x1d92c2;
    run_test_udp_alloc_cb_fail_cold_14();
LAB_001d92c2:
    auStack_198._8_8_ = (uv__queue *)0x1d92d1;
    run_test_udp_alloc_cb_fail_cold_15();
LAB_001d92d1:
    auStack_198._8_8_ = (uv__queue *)0x1d92e0;
    run_test_udp_alloc_cb_fail_cold_16();
LAB_001d92e0:
    auStack_198._8_8_ = (uv__queue *)0x1d92ef;
    run_test_udp_alloc_cb_fail_cold_17();
  }
  puVar7 = (uv_udp_t *)local_178;
  auStack_198._8_8_ = sv_alloc_cb;
  run_test_udp_alloc_cb_fail_cold_18();
  bVar4 = puVar7 == &client || puVar7 == &server;
  puVar5 = (uv_loop_t *)CONCAT71(0xf8c1,bVar4);
  auStack_198._8_8_ = ZEXT18(bVar4);
  auStack_198._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_198._8_8_ != (uv__queue *)0x0) {
    *extraout_RDX = sv_alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0xf8c1e0;
  }
  puVar7 = (uv_udp_t *)(auStack_198 + 8);
  puVar6 = (uv__queue *)auStack_198;
  sv_alloc_cb_cold_1();
  puStack_1b8 = unaff_RBX;
  if ((long)puVar6 < 0) {
    puStack_1e0 = (uv__queue *)0x1d94ca;
    sv_recv_cb_cold_10();
    puVar5 = unaff_RBX;
LAB_001d94ca:
    puStack_1e0 = (uv__queue *)0x1d94d7;
    sv_recv_cb_cold_8();
LAB_001d94d7:
    puStack_1e0 = (uv__queue *)0x1d94e4;
    sv_recv_cb_cold_1();
LAB_001d94e4:
    puStack_1e0 = (uv__queue *)0x1d94e9;
    sv_recv_cb_cold_7();
LAB_001d94e9:
    puStack_1e0 = (uv__queue *)0x1d94f6;
    sv_recv_cb_cold_2();
LAB_001d94f6:
    puStack_1e0 = (uv__queue *)0x1d94fb;
    sv_recv_cb_cold_3();
LAB_001d94fb:
    puStack_1e0 = (uv__queue *)0x1d9508;
    sv_recv_cb_cold_4();
LAB_001d9508:
    puStack_1e0 = (uv__queue *)0x1d950d;
    sv_recv_cb_cold_6();
LAB_001d950d:
    iVar1 = (int)&sStack_1c0;
    puStack_1e0 = (uv__queue *)0x1d951a;
    sv_recv_cb_cold_5();
  }
  else {
    if (puVar6 != (uv__queue *)0x0) {
      auStack_1d0._0_8_ = ZEXT18(puVar7 == &client || puVar7 == &server);
      puStack_1d8 = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_1d0._0_8_ == (uv_handle_t *)0x0) goto LAB_001d94ca;
      auStack_1d0._0_8_ = (ulong)in_R8 & 0xffffffff;
      puStack_1d8 = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_1d0._0_8_ != (uv_handle_t *)0x0) goto LAB_001d94d7;
      if (puVar5 == (uv_loop_t *)0x0) goto LAB_001d94e4;
      auStack_1d0._0_8_ = (uv_handle_t *)0x4;
      puStack_1d8 = puVar6;
      if (puVar6 != (uv__queue *)0x4) goto LAB_001d94e9;
      puStack_1e0 = (uv__queue *)0x1d9416;
      iVar1 = bcmp("PING",(void *)*extraout_RDX_00,4);
      if (iVar1 != 0) goto LAB_001d94f6;
      puStack_1e0 = (uv__queue *)0x1d9426;
      iVar1 = uv_udp_recv_stop(puVar7);
      auStack_1d0._0_8_ = SEXT48(iVar1);
      puStack_1d8 = (uv__queue *)0x0;
      if ((uv_handle_t *)auStack_1d0._0_8_ != (uv_handle_t *)0x0) goto LAB_001d94fb;
      puStack_1e0 = (uv__queue *)0x1d944e;
      pvVar3 = malloc(0x148);
      if (pvVar3 == (void *)0x0) goto LAB_001d9508;
      puStack_1e0 = (uv__queue *)0x1d946b;
      auStack_1d0 = uv_buf_init("PONG",4);
      puStack_1e0 = (uv__queue *)0x1d9494;
      iVar1 = uv_udp_send(pvVar3,puVar7,auStack_1d0,1,puVar5,sv_send_cb);
      puStack_1d8 = (uv__queue *)(long)iVar1;
      sStack_1c0 = 0;
      if (puStack_1d8 == (uv__queue *)0x0) {
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return iVar1;
      }
      goto LAB_001d950d;
    }
    iVar1 = 0;
    if (puVar5 == (uv_loop_t *)0x0) {
      return extraout_EAX;
    }
  }
  puStack_1e0 = (uv__queue *)cl_send_cb;
  puVar8 = puVar5;
  sv_recv_cb_cold_9();
  if (puVar8 == (uv_loop_t *)0x0) {
    puStack_1f8 = (uv_loop_t *)0x1d95c8;
    cl_send_cb_cold_4();
LAB_001d95c8:
    puStack_1f8 = (uv_loop_t *)0x1d95d7;
    cl_send_cb_cold_1();
LAB_001d95d7:
    puStack_1f8 = (uv_loop_t *)0x1d95e6;
    cl_send_cb_cold_3();
  }
  else {
    puStack_1e0 = (uv__queue *)(long)iVar1;
    p_Stack_1e8 = (uv_close_cb)0x0;
    if (puStack_1e0 != (uv__queue *)0x0) goto LAB_001d95c8;
    puVar7 = (uv_udp_t *)puVar8->reserved[2];
    puStack_1e0 = (uv__queue *)(ulong)(puVar7 == &client || puVar7 == &server);
    p_Stack_1e8 = (uv_close_cb)0x0;
    if (puStack_1e0 == (uv__queue *)0x0) goto LAB_001d95d7;
    puStack_1f8 = (uv_loop_t *)0x1d959c;
    iVar1 = uv_udp_recv_start(puVar7,cl_alloc_cb,cl_recv_cb);
    puStack_1e0 = (uv__queue *)(long)iVar1;
    p_Stack_1e8 = (uv_close_cb)0x0;
    if (puStack_1e0 == (uv__queue *)0x0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return iVar1;
    }
  }
  __ptr = &puStack_1e0;
  iVar1 = (int)&p_Stack_1e8;
  puStack_1f8 = (uv_loop_t *)sv_send_cb;
  cl_send_cb_cold_2();
  puStack_1f8 = puVar5;
  if (__ptr == (uv__queue **)0x0) {
    sv_send_cb_cold_3();
  }
  else {
    pvStack_200 = (void *)(long)iVar1;
    if (pvStack_200 == (void *)0x0) {
      puVar7 = (uv_udp_t *)__ptr[9];
      pvStack_200 = (void *)(ulong)(puVar7 == &client || puVar7 == &server);
      if (pvStack_200 != (void *)0x0) {
        uv_close(puVar7,close_cb);
        free(__ptr);
        sv_send_cb_called = sv_send_cb_called + 1;
        return extraout_EAX_00;
      }
      goto LAB_001d968a;
    }
  }
  sv_send_cb_cold_1();
LAB_001d968a:
  puVar7 = (uv_udp_t *)&pvStack_200;
  sv_send_cb_cold_2();
  if (puVar7 == &client || puVar7 == &server) {
    iVar1 = uv_is_closing();
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return 1;
    }
  }
  else {
    close_cb_cold_2();
  }
  close_cb_cold_1();
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_send_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);
  ASSERT_OK(sv_recv_cb_called);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, cl_send_cb_called);
  ASSERT_EQ(1, cl_recv_cb_called);
  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}